

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

void strip_trailing_dot(hostname *host)

{
  size_t sVar1;
  size_t len;
  hostname *host_local;
  
  if ((((host != (hostname *)0x0) && (host->name != (char *)0x0)) &&
      (sVar1 = strlen(host->name), sVar1 != 0)) && (host->name[sVar1 - 1] == '.')) {
    host->name[sVar1 - 1] = '\0';
  }
  return;
}

Assistant:

static void strip_trailing_dot(struct hostname *host)
{
  size_t len;
  if(!host || !host->name)
    return;
  len = strlen(host->name);
  if(len && (host->name[len-1] == '.'))
    host->name[len-1] = 0;
}